

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O2

void __thiscall
imrt::Collimator::Collimator
          (Collimator *this,string *coord_filename,
          set<int,_std::less<int>,_std::allocator<int>_> *angles)

{
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  iterator iVar3;
  int angle;
  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
  *local_2c0;
  list<int,_std::allocator<int>_> *local_2a8;
  string aux;
  string line;
  undefined1 local_260 [40];
  ifstream coord_file;
  byte abStack_218 [488];
  
  p_Var1 = &(this->beam_coord)._M_t._M_impl.super__Rb_tree_header;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->angle_coord)._M_t._M_impl.super__Rb_tree_header;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->angle_coord)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->angle_row_beam_active)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->nb_angle_beamlets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a8 = &this->angles;
  (this->angles).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)local_2a8;
  (this->angles).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)local_2a8;
  (this->angles).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  local_2c0 = (vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
               *)&this->coord_files;
  (this->coord_files).
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coord_files).
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coord_files).
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->reference)._M_t._M_impl.super__Rb_tree_header;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->reference)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->intensity_to_levels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::ifstream::ifstream(&coord_file,(coord_filename->_M_dataplus)._M_p,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  aux._M_dataplus._M_p = (pointer)&aux.field_2;
  aux._M_string_length = 0;
  aux.field_2._M_local_buf[0] = '\0';
  if ((abStack_218[*(long *)(_coord_file + -0x18)] & 5) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: unable to open instance file: ");
    poVar2 = std::operator<<(poVar2,(string *)coord_filename);
    std::operator<<(poVar2,", stopping! \n");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"##Reading collimator coordinates info.");
  std::endl<char,std::char_traits<char>>(poVar2);
  while ((abStack_218[*(long *)(_coord_file + -0x18)] & 5) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&coord_file,(string *)&line);
    if (line._M_string_length != 0) {
      std::__cxx11::string::find((string *)&line,0x13b3a0);
      std::__cxx11::string::substr((ulong)local_260,(ulong)&line);
      std::__cxx11::string::operator=((string *)&aux,(string *)local_260);
      std::__cxx11::string::~string((string *)local_260);
      angle = atoi(aux._M_dataplus._M_p);
      iVar3 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              find(&angles->_M_t,&angle);
      if ((_Rb_tree_header *)iVar3._M_node != &(angles->_M_t)._M_impl.super__Rb_tree_header) {
        std::__cxx11::string::find((string *)&line,0x13b3a0);
        std::__cxx11::string::erase((ulong)&line,0);
        poVar2 = std::operator<<((ostream *)&std::cout,"##  ");
        poVar2 = std::operator<<(poVar2,(string *)&line);
        poVar2 = std::operator<<(poVar2," a:");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,angle);
        std::endl<char,std::char_traits<char>>(poVar2);
        local_260._0_4_ = angle;
        std::__cxx11::string::string((string *)(local_260 + 8),(string *)&line);
        std::
        vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
        ::emplace_back<std::pair<int,std::__cxx11::string>>
                  (local_2c0,
                   (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_260);
        std::__cxx11::string::~string((string *)(local_260 + 8));
      }
    }
  }
  std::ifstream::close();
  this->n_angles =
       (int)(((long)(this->coord_files).
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->coord_files).
                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x28);
  initializeCoordinates
            (this,(vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_2c0);
  poVar2 = std::operator<<((ostream *)&std::cout,"##  Read ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," files.");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&aux);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&coord_file);
  return;
}

Assistant:

Collimator::Collimator(string coord_filename, set<int> angles) {
    ifstream coord_file(coord_filename.c_str(), ios::in);
    string line, aux;
    int angle;

    if (! coord_file)
      cerr << "ERROR: unable to open instance file: " << coord_filename << ", stopping! \n";

    cout << "##Reading collimator coordinates info." << endl;
    while (coord_file) {
      getline(coord_file, line);
      if (line.empty()) continue;
      aux   = line.substr(0, line.find(delimiter));
      angle = atoi(aux.c_str());
      if (angles.find(angle) == angles.end()) continue;
      line.erase(0, line.find(delimiter) + delimiter.length());
      cout << "##  " << line << " a:" << angle << endl;
      coord_files.push_back(make_pair(angle,line));
    }
    coord_file.close();
    n_angles=coord_files.size();
    initializeCoordinates(coord_files);
    cout << "##  Read " << coord_files.size()<< " files."<< endl;
  }